

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::GetQPitchPlanar(GmmResourceInfoCommon *this,GMM_YUV_PLANE Plane)

{
  GMM_PLATFORM_INFO *pPlatform;
  uint32_t QPitch;
  GMM_YUV_PLANE Plane_local;
  GmmResourceInfoCommon *this_local;
  
  (*this->pClientContext->_vptr_GmmClientContext[0x10])();
  return (uint32_t)
         ((this->Surf).OffsetInfo.field_0.Texture3DOffsetInfo.Mip0SlicePitch / (this->Surf).Pitch);
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED uint32_t GMM_STDCALL GetQPitchPlanar(GMM_YUV_PLANE Plane)
            {
                uint32_t               QPitch;
                const GMM_PLATFORM_INFO   *pPlatform;

                __GMM_ASSERT(GMM_IS_PLANAR(Surf.Format));
                GMM_UNREFERENCED_LOCAL_VARIABLE(Plane);

                pPlatform = (GMM_PLATFORM_INFO *)GMM_OVERRIDE_EXPORTED_PLATFORM_INFO(&Surf, GetGmmLibContext());
	       
	        __GMM_ASSERT(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN8_CORE);
		GMM_UNREFERENCED_PARAMETER(pPlatform);

                QPitch = static_cast<uint32_t>(Surf.OffsetInfo.Plane.ArrayQPitch / Surf.Pitch);

                return QPitch;
            }